

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double bessel_i0(double arg)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double xx;
  double xsmall;
  double xmax;
  double x;
  double value;
  double sumq;
  double sump;
  double rec15;
  double r8_huge;
  double qq [7];
  double local_118;
  double q [5];
  double local_e8;
  double pp [8];
  double p [15];
  int i;
  double exp40;
  double b;
  double a;
  double arg_local;
  
  memcpy(pp + 7,&DAT_0025e720,0x78);
  memcpy(&local_e8,&DAT_0025e7a0,0x40);
  memset(&local_118,0,0x28);
  local_118 = -3727.7560179962775;
  q[0] = 6515850.641865517;
  q[1] = -6562656074.083387;
  q[2] = 3760418870409.2954;
  q[3] = -970879461795940.2;
  memcpy(&r8_huge,&DAT_0025e7e0,0x38);
  x = 0.0;
  dVar1 = ABS(arg);
  if (2.98e-08 <= dVar1) {
    if (15.0 <= dVar1) {
      if (15.0 <= dVar1) {
        if (dVar1 <= 91.9) {
          dVar2 = 1.0 / dVar1 - 0.06666666666666667;
          dVar3 = local_e8 * dVar2;
          if (76.9 < dVar1) {
            b = exp(dVar1 - 40.0);
            exp40 = 2.3538526683702e+17;
          }
          else {
            b = exp(dVar1);
            exp40 = 1.0;
          }
          dVar1 = sqrt(dVar1);
          x = ((((((((((dVar3 + pp[0]) * dVar2 + pp[1]) * dVar2 + pp[2]) * dVar2 + pp[3]) * dVar2 +
                   pp[4]) * dVar2 + pp[5]) * dVar2 + pp[6]) /
                (((((((dVar2 + r8_huge) * dVar2 + qq[0]) * dVar2 + qq[1]) * dVar2 + qq[2]) * dVar2 +
                  qq[3]) * dVar2 + qq[4]) * dVar2 + qq[5])) * b + -(local_e8 * b)) / dVar1) * exp40;
        }
        else {
          x = 1e+30;
        }
      }
    }
    else {
      sumq = pp[7];
      for (p[0xe]._4_4_ = 1; p[0xe]._4_4_ < 0xf; p[0xe]._4_4_ = p[0xe]._4_4_ + 1) {
        sumq = sumq * dVar1 * dVar1 + pp[(long)p[0xe]._4_4_ + 7];
      }
      dVar1 = dVar1 * dVar1 - 225.0;
      x = sumq / (((((dVar1 + local_118) * dVar1 + q[0]) * dVar1 + q[1]) * dVar1 + q[2]) * dVar1 +
                 q[3]);
    }
  }
  else {
    x = 1.0;
  }
  return x;
}

Assistant:

double bessel_i0 ( double arg )

//****************************************************************************80
//
//  Purpose:
//
//    BESSEL_I0 evaluates the modified Bessel function I0.
//
//  Discussion:
//
//    The main computation evaluates slightly modified forms of
//    minimax approximations generated by Blair and Edwards, Chalk
//    River (Atomic Energy of Canada Limited) Report AECL-4928,
//    October, 1974.  This transportable program is patterned after
//    the machine dependent FUNPACK packet NATSI0, but cannot match
//    that version for efficiency or accuracy.  This version uses
//    rational functions that theoretically approximate I-SUB-0(X)
//    to at least 18 significant decimal digits.
//
//  Machine dependent constants:
//
//    beta   = Radix for the floating-point system
//    maxexp = Smallest power of beta that overflows
//    XSMALL = Positive argument such that 1.0 - X = 1.0 to
//             machine precision for all ABS(X) .LE. XSMALL.
//    XMAX =   Largest argument acceptable to BESI0;  Solution to
//             equation:
//               W(X) * (1+1/(8*X)+9/(128*X^2) = beta^maxexp
//             where  W(X) = EXP(X)/sqrt(2*PI*X)
//
//    Approximate values for some important machines are:
//
//                             beta       maxexp       XSMALL
//
//    CRAY-1        (S.P.)       2         8191       3.55D-15
//    Cyber 180/855
//      under NOS   (S.P.)       2         1070       3.55D-15
//    IEEE (IBM/XT,
//      SUN, etc.)  (S.P.)       2          128       2.98D-8
//    IEEE (IBM/XT,
//      SUN, etc.)  (D.P.)       2         1024       5.55D-17
//    IBM 3033      (D.P.)      16           63       6.95D-18
//    VAX           (S.P.)       2          127       2.98D-8
//    VAX D-Format  (D.P.)       2          127       6.95D-18
//    VAX G-Format  (D.P.)       2         1023       5.55D-17
//
//
//                                  XMAX
//
//    CRAY-1        (S.P.)       5682.810
//    Cyber 180/855
//      under NOS   (S.P.)       745.893
//    IEEE (IBM/XT,
//      SUN, etc.)  (S.P.)        91.900
//    IEEE (IBM/XT,
//      SUN, etc.)  (D.P.)       713.986
//    IBM 3033      (D.P.)       178.182
//    VAX           (S.P.)        91.203
//    VAX D-Format  (D.P.)        91.203
//    VAX G-Format  (D.P.)       713.293
//
//  Author:
//
//    Original FORTRAN77 version by W. J. Cody and L. Stoltz.
//    C++ version by John Burkardt.
//
//  Parameters:
//
//    Input, double ARG, the argument.
//
//    Output, double BESSEL_I0, the value of the modified Bessel function
//    of the first kind.
//
{
  double a;
  double b;
  double exp40 = 2.353852668370199854E+17;
  int i;
  double p[15] = {
    -5.2487866627945699800E-18,
    -1.5982226675653184646E-14,
    -2.6843448573468483278E-11,
    -3.0517226450451067446E-08,
    -2.5172644670688975051E-05,
    -1.5453977791786851041E-02,
    -7.0935347449210549190,
    -2.4125195876041896775E+03,
    -5.9545626019847898221E+05,
    -1.0313066708737980747E+08,
    -1.1912746104985237192E+10,
    -8.4925101247114157499E+11,
    -3.2940087627407749166E+13,
    -5.5050369673018427753E+14,
    -2.2335582639474375249E+15 };
  double pp[8] = {
    -3.9843750000000000000E-01,
     2.9205384596336793945,
    -2.4708469169133954315,
     4.7914889422856814203E-01,
    -3.7384991926068969150E-03,
    -2.6801520353328635310E-03,
     9.9168777670983678974E-05,
    -2.1877128189032726730E-06 };
  double q[5] = {
    -3.7277560179962773046E+03,
     6.5158506418655165707E+06,
    -6.5626560740833869295E+09,
     3.7604188704092954661E+12,
    -9.7087946179594019126E+14 };
  double qq[7] = {
    -3.1446690275135491500E+01,
     8.5539563258012929600E+01,
    -6.0228002066743340583E+01,
     1.3982595353892851542E+01,
    -1.1151759188741312645,
     3.2547697594819615062E-02,
    -5.5194330231005480228E-04 };
  const double r8_huge = 1.0E+30;
  double rec15 = 6.6666666666666666666E-02;
  double sump;
  double sumq;
  double value = 0.0;
  double x;
  double xmax = 91.9;
  double xsmall = 2.98E-08;
  double xx;

  x = fabs ( arg );

  if ( x < xsmall )
  {
    value = 1.0;
  }
  else if ( x < 15.0 )
  {
//
//  XSMALL <= ABS(ARG) < 15.0
//
    xx = x * x;
    sump = p[0];
    for ( i = 1; i < 15; i++ )
    {
      sump = sump * xx + p[i];
    }

    xx = xx - 225.0;
    sumq = ((((
           xx + q[0] )
         * xx + q[1] )
         * xx + q[2] )
         * xx + q[3] )
         * xx + q[4];

    value = sump / sumq;
  }
  else if ( 15.0 <= x )
  {
    if ( xmax < x )
    {
      value = r8_huge;
    }
    else
    {
//
//  15.0 <= ABS(ARG)
//
      xx = 1.0 / x - rec15;

      sump = ((((((
                  pp[0]
           * xx + pp[1] )
           * xx + pp[2] )
           * xx + pp[3] )
           * xx + pp[4] )
           * xx + pp[5] )
           * xx + pp[6] )
           * xx + pp[7];

      sumq = ((((((
             xx + qq[0] )
           * xx + qq[1] )
           * xx + qq[2] )
           * xx + qq[3] )
           * xx + qq[4] )
           * xx + qq[5] )
           * xx + qq[6];

      value = sump / sumq;
//
//  Calculation reformulated to avoid premature overflow.
//
      if ( x <= xmax - 15.0 )
      {
        a = exp ( x );
        b = 1.0;
      }
      else
      {
        a = exp ( x - 40.0 );
        b = exp40;
      }

      value = ( ( value * a - pp[0] * a ) / sqrt ( x ) ) * b;
    }
  }

  return value;
}